

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O1

const_iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::upper_bound
          (const_iterator *__return_storage_ptr__,
          setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,key_type *k)

{
  rbtree *prVar1;
  treeNode<int> *ptVar2;
  treeNode<int> *ptVar3;
  treeNode<int> *ptVar4;
  treeNode<int> *ptVar5;
  bool bVar6;
  
  prVar1 = &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree;
  ptVar2 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_last;
  ptVar4 = ((this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_first
           )->parent;
  bVar6 = ptVar4 == ptVar2;
  if (!bVar6) {
    if (ptVar4->value <= *k) {
      do {
        ptVar3 = ptVar4->right;
        ptVar5 = ptVar4;
        if (ptVar4->right == prVar1->NIL) {
          do {
            ptVar4 = ptVar5->parent;
            bVar6 = ptVar4->right == ptVar5;
            ptVar5 = ptVar4;
          } while (bVar6);
        }
        else {
          do {
            ptVar4 = ptVar3;
            ptVar3 = ptVar4->left;
          } while (ptVar4->left != prVar1->NIL);
        }
        bVar6 = ptVar4 == ptVar2;
        if (bVar6) goto LAB_00108dc6;
      } while (ptVar4->value <= *k);
    }
    (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_tree =
         prVar1;
    (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_node =
         ptVar4;
    (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).
    _vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcb8;
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_00108dc6:
  (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_tree =
       prVar1;
  (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_node =
       ptVar2;
  (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).
  _vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcb8;
  return __return_storage_ptr__;
}

Assistant:

const_iterator	upper_bound(key_type const & k) const
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, *it)) return it;
		}
		return this->end();
	}